

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

Wlc_Ntk_t * Wlc_NtkDupSingleNodes(Wlc_Ntk_t *p)

{
  int iVar1;
  int Id;
  Wlc_Obj_t *pWVar2;
  Vec_Int_t *vFanins_00;
  Wlc_Ntk_t *p_00;
  Wlc_Obj_t *pWVar3;
  int Count;
  int iObjNew;
  int iFaninNew;
  int iFanin;
  int k;
  int i;
  Wlc_Obj_t *pFaninNew;
  Wlc_Obj_t *pFanin;
  Wlc_Obj_t *pObjNew;
  Wlc_Obj_t *pObj;
  Vec_Int_t *vFanins;
  Wlc_Ntk_t *pNew;
  Wlc_Ntk_t *p_local;
  
  for (iFanin = 1; iVar1 = Wlc_NtkObjNumMax(p), iFanin < iVar1; iFanin = iFanin + 1) {
    pWVar2 = Wlc_NtkObj(p,iFanin);
    iVar1 = Wlc_ObjIsCi(pWVar2);
    if (iVar1 == 0) {
      Wlc_ObjFaninNum(pWVar2);
    }
  }
  Wlc_NtkCleanCopy(p);
  vFanins_00 = Vec_IntAlloc(100);
  p_00 = Wlc_NtkAlloc(p->pName,p->nObjsAlloc);
  for (iFanin = 1; iVar1 = Wlc_NtkObjNumMax(p), iFanin < iVar1; iFanin = iFanin + 1) {
    pWVar2 = Wlc_NtkObj(p,iFanin);
    iVar1 = Wlc_ObjIsCi(pWVar2);
    if (((iVar1 == 0) &&
        ((undefined1  [24])((undefined1  [24])*pWVar2 & (undefined1  [24])0x3f) !=
         (undefined1  [24])0x26)) &&
       (((undefined1  [24])((undefined1  [24])*pWVar2 & (undefined1  [24])0x3f) !=
         (undefined1  [24])0x8 || (iVar1 = Wlc_ObjFaninNum(pWVar2), iVar1 < 4)))) {
      for (iFaninNew = 0; iVar1 = Wlc_ObjFaninNum(pWVar2), iFaninNew < iVar1;
          iFaninNew = iFaninNew + 1) {
        iVar1 = Wlc_ObjFaninId(pWVar2,iFaninNew);
        pWVar3 = Wlc_NtkObj(p,iVar1);
        Id = Wlc_ObjAlloc(p_00,1,(uint)(*(ushort *)pWVar3 >> 6 & 1),pWVar3->End,pWVar3->Beg);
        Wlc_NtkObj(p_00,Id);
        Wlc_ObjSetCopy(p,iVar1,Id);
      }
      iVar1 = Wlc_ObjDup(p_00,p,iFanin,vFanins_00);
      pWVar2 = Wlc_NtkObj(p_00,iVar1);
      *(ushort *)pWVar2 = *(ushort *)pWVar2 & 0xfeff | 0x100;
      Vec_IntPush(&p_00->vPos,iVar1);
    }
  }
  Vec_IntFree(vFanins_00);
  Wlc_NtkTransferNames(p_00,p);
  return p_00;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkDupSingleNodes( Wlc_Ntk_t * p )
{
    Wlc_Ntk_t * pNew;
    Vec_Int_t * vFanins;
    Wlc_Obj_t * pObj, * pObjNew;
    Wlc_Obj_t * pFanin, * pFaninNew;
    int i, k, iFanin, iFaninNew, iObjNew, Count = 0;
    // count objects
    Wlc_NtkForEachObj( p, pObj, i )
        if ( !Wlc_ObjIsCi(pObj) )
            Count += 1 + Wlc_ObjFaninNum(pObj);
    // copy objects
    Wlc_NtkCleanCopy( p );
    vFanins = Vec_IntAlloc( 100 );
    pNew = Wlc_NtkAlloc( p->pName, p->nObjsAlloc );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( Wlc_ObjIsCi(pObj) )
            continue;
        if ( pObj->Type == WLC_OBJ_ARI_MULTI )
            continue;
        if ( pObj->Type == WLC_OBJ_MUX && Wlc_ObjFaninNum(pObj) > 3 )
            continue;
        // create CIs for the fanins
        Wlc_ObjForEachFanin( pObj, iFanin, k )
        {
            pFanin = Wlc_NtkObj(p, iFanin);
            iFaninNew = Wlc_ObjAlloc( pNew, WLC_OBJ_PI, pFanin->Signed, pFanin->End, pFanin->Beg );
            pFaninNew = Wlc_NtkObj(pNew, iFaninNew);
            Wlc_ObjSetCopy( p, iFanin, iFaninNew );
            //Wlc_ObjSetCi( pNew, pFaninNew );
        }
        // create object
        iObjNew = Wlc_ObjDup( pNew, p, i, vFanins );
        pObjNew = Wlc_NtkObj(pNew, iObjNew);
        pObjNew->fIsPo = 1;
        Vec_IntPush( &pNew->vPos, iObjNew );
    }
    Vec_IntFree( vFanins );
    Wlc_NtkTransferNames( pNew, p );
    return pNew;
}